

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::del_line(OSDText *this,int line_id)

{
  bool bVar1;
  pointer pOVar2;
  int in_ESI;
  long in_RDI;
  iterator it;
  vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  *in_stack_ffffffffffffffc0;
  vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_18;
  int local_c;
  
  local_c = in_ESI;
  local_18._M_current =
       (OSDLine *)
       std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::begin
                 (in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
             ::operator->(&local_18);
    if (pOVar2->id == local_c) break;
    __gnu_cxx::
    __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
    ::operator++(&local_18);
  }
  __gnu_cxx::
  __normal_iterator<CMU462::OSDLine_const*,std::vector<CMU462::OSDLine,std::allocator<CMU462::OSDLine>>>
  ::__normal_iterator<CMU462::OSDLine*>
            ((__normal_iterator<const_CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
              *)(in_RDI + 0x30),
             (__normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
              *)in_stack_ffffffffffffffb8);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::erase
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void OSDText::del_line(int line_id) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      lines.erase(it);
      break;
    }
    ++it;
  }
}